

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week11-hw-solution.cpp
# Opt level: O2

void print<std::__cxx11::list<int,std::allocator<int>>>(list<int,_std::allocator<int>_> *value)

{
  ostream *poVar1;
  list<int,_std::allocator<int>_> *__range2;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)value;
  while (p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var2 != (_List_node_base *)value) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[1]._M_next);
    std::operator<<(poVar1,"]");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print(const T& value)
{
    if constexpr(IsContainer<T>)
    {
        for(const auto& item : value)
            std::cout << "[" << item << "]";
        std::cout << std::endl;
    }
    else
    {
        std::cout << value << std::endl;
    }
}